

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EscapeCodeGenerator.hpp
# Opt level: O1

EscapeCode * __thiscall
yb::ANSIEscapeCodeGenerator::cursorForward_abi_cxx11_
          (EscapeCode *__return_storage_ptr__,ANSIEscapeCodeGenerator *this,uint n)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  uint uVar8;
  long *local_68;
  ulong local_60;
  long local_58;
  long lStack_50;
  size_type *local_48;
  string __str;
  
  if (n == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    if (n == 1) {
      local_48 = &__str._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48);
    }
    else {
      cVar4 = '\x01';
      if (9 < n) {
        uVar8 = n;
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar8 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_0015c3a3;
          }
          if (uVar8 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_0015c3a3;
          }
          if (uVar8 < 10000) goto LAB_0015c3a3;
          bVar1 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar1);
        cVar4 = cVar4 + '\x01';
      }
LAB_0015c3a3:
      local_48 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_48,(uint)__str._M_dataplus._M_p,n);
    }
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_48,0,(char *)0x0,
                                (ulong)(this->EscapeCodeStart)._M_dataplus._M_p);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_58 = *plVar6;
      lStack_50 = plVar5[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar6;
      local_68 = (long *)*plVar5;
    }
    local_60 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_48 != &__str._M_string_length) {
      operator_delete(local_48,__str._M_string_length + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EscapeCode cursorForward(unsigned int n) const override {
        if (!n) return EscapeCode{};
        return EscapeCodeStart + (n == 1 ? "" : std::to_string(n)) + 'C';
    }